

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view_catalog_entry.cpp
# Opt level: O2

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::ViewCatalogEntry::Copy(ViewCatalogEntry *this,ClientContext *context)

{
  Catalog *args;
  SchemaCatalogEntry *args_1;
  CreateViewInfo *args_2;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_30;
  _func_int **local_28;
  
  (*(code *)(((context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->config).
            home_directory._M_string_length)(&local_30);
  args = (Catalog *)(context->config).max_expression_depth;
  args_1 = *(SchemaCatalogEntry **)&(context->config).query_verification_enabled;
  args_2 = (CreateViewInfo *)
           unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                       *)&local_30);
  make_uniq<duckdb::ViewCatalogEntry,duckdb::Catalog&,duckdb::SchemaCatalogEntry&,duckdb::CreateViewInfo&>
            ((duckdb *)&local_28,args,args_1,args_2);
  (this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry = local_28;
  if (local_30._M_head_impl != (CreateInfo *)0x0) {
    (*((local_30._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)this;
}

Assistant:

unique_ptr<CatalogEntry> ViewCatalogEntry::Copy(ClientContext &context) const {
	D_ASSERT(!internal);
	auto create_info = GetInfo();

	return make_uniq<ViewCatalogEntry>(catalog, schema, create_info->Cast<CreateViewInfo>());
}